

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.h
# Opt level: O2

void __thiscall ser::MetainfoSet::AddMetainfo<bool>(MetainfoSet *this,string *key,bool *value)

{
  bool bVar1;
  mapped_type *this_00;
  SerializationException *this_01;
  SerializationException exception;
  string msg;
  
  bVar1 = HasKey(this,key);
  if (!bVar1) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              ::operator[](&this->data_,key);
    boost::any::operator=(this_00,value);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exception,
                 "Error: metainfo with key = ",key);
  std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &exception," exists already\n");
  std::__cxx11::string::~string((string *)&exception);
  exception._0_8_ = &PTR__SerializationException_00199680;
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_01,&exception);
  __cxa_throw(this_01,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

inline void AddMetainfo(const std::string& key, const ValueType& value)
        {
            // Check that type of meta info is supported
            BOOST_STATIC_ASSERT((   boost::is_same<ValueType, int        >::type::value
                                    || boost::is_same<ValueType, bool       >::type::value
                                    || boost::is_same<ValueType, float      >::type::value
                                    || boost::is_same<ValueType, double     >::type::value
                                    || boost::is_same<ValueType, std::string>::type::value
                                    ));

            // Check that key does not exist yet
            if(HasKey(key))
            {
                std::string msg = "Error: metainfo with key = " + key + " exists already\n";
                SerializationException exception;
                exception.Init(msg);
                throw exception;
            }

            // Set key = value
            data_[key] = value;
        }